

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  char *pcVar2;
  tbinptr pmVar3;
  tbinptr pmVar4;
  malloc_tree_chunk *pmVar5;
  malloc_tree_chunk *pmVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  malloc_tree_chunk *pmVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  tbinptr pmVar15;
  size_t __len;
  
  pmVar1 = (tbinptr)((long)&p->prev_foot + psize);
  if ((p->head & 1) == 0) {
    uVar13 = p->prev_foot;
    if ((p->head & 2) == 0) {
      __len = psize + uVar13 + 0x20;
      iVar8 = munmap((void *)((long)p - uVar13),__len);
      if (iVar8 != 0) {
        return;
      }
      m->footprint = m->footprint - __len;
      return;
    }
    p = (mchunkptr)((long)p - uVar13);
    pmVar3 = (tbinptr)m->least_addr;
    if (p < pmVar3) goto LAB_00104e79;
    psize = psize + uVar13;
    if ((tbinptr)p == (tbinptr)m->dv) {
      uVar13 = pmVar1->head;
      if ((~(uint)uVar13 & 3) == 0) {
        m->dvsize = psize;
        pmVar1->head = uVar13 & 0xfffffffffffffffe;
        ((tbinptr)p)->head = psize | 1;
        pmVar1->prev_foot = psize;
        return;
      }
    }
    else if (uVar13 < 0x100) {
      pmVar4 = ((tbinptr)p)->fd;
      pmVar15 = ((tbinptr)p)->bk;
      if ((pmVar4 != (tbinptr)(m->smallbins + (uVar13 >> 3) * 2)) &&
         ((pmVar4 < pmVar3 || (pmVar4->bk != (malloc_tree_chunk *)p)))) goto LAB_00104e79;
      if (pmVar15 == pmVar4) {
        bVar11 = (byte)(uVar13 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar15 != (tbinptr)(m->smallbins + (uVar13 >> 3) * 2)) &&
           ((pmVar15 < pmVar3 || (pmVar15->fd != (malloc_tree_chunk *)p)))) goto LAB_00104e79;
        pmVar4->bk = pmVar15;
        pmVar15->fd = pmVar4;
      }
    }
    else {
      pmVar10 = ((tbinptr)p)->bk;
      pmVar5 = ((tbinptr)p)->child[2];
      if (pmVar10 == (malloc_tree_chunk *)p) {
        if (((tbinptr)p)->child[1] == (malloc_tree_chunk *)0x0) {
          if (((tbinptr)p)->child[0] == (malloc_tree_chunk *)0x0) {
            pmVar10 = (malloc_tree_chunk *)0x0;
            goto LAB_00104a19;
          }
          pmVar6 = ((tbinptr)p)->child[0];
          pmVar4 = (tbinptr)((tbinptr)p)->child;
        }
        else {
          pmVar6 = ((tbinptr)p)->child[1];
          pmVar4 = (tbinptr)(((tbinptr)p)->child + 1);
        }
        do {
          do {
            pmVar15 = pmVar4;
            pmVar10 = pmVar6;
            pmVar6 = pmVar10->child[1];
            pmVar4 = (tbinptr)(pmVar10->child + 1);
          } while (pmVar10->child[1] != (malloc_tree_chunk *)0x0);
          pmVar6 = pmVar10->child[0];
          pmVar4 = (tbinptr)pmVar10->child;
        } while (pmVar10->child[0] != (malloc_tree_chunk *)0x0);
        if (pmVar15 < pmVar3) goto LAB_00104e79;
        pmVar15->prev_foot = 0;
      }
      else {
        pmVar4 = ((tbinptr)p)->fd;
        if (((pmVar4 < pmVar3) || (pmVar4->bk != (malloc_tree_chunk *)p)) ||
           (pmVar10->fd != (malloc_tree_chunk *)p)) goto LAB_00104e79;
        pmVar4->bk = pmVar10;
        pmVar10->fd = pmVar4;
      }
LAB_00104a19:
      if (pmVar5 != (malloc_tree_chunk *)0x0) {
        uVar9 = *(uint *)(((tbinptr)p)->child + 3);
        if ((tbinptr)p == m->treebins[uVar9]) {
          m->treebins[uVar9] = pmVar10;
          if (pmVar10 == (malloc_tree_chunk *)0x0) {
            bVar11 = (byte)uVar9 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
          }
          else {
LAB_00104a5b:
            pmVar6 = (malloc_tree_chunk *)m->least_addr;
            if (pmVar10 < pmVar6) goto LAB_00104e79;
            pmVar10->child[2] = pmVar5;
            pmVar5 = ((tbinptr)p)->child[0];
            if (pmVar5 != (malloc_tree_chunk *)0x0) {
              if (pmVar5 < pmVar6) goto LAB_00104e79;
              pmVar10->child[0] = pmVar5;
              pmVar5->child[2] = pmVar10;
            }
            pmVar5 = ((tbinptr)p)->child[1];
            if (pmVar5 != (malloc_tree_chunk *)0x0) {
              if (pmVar5 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104e79;
              pmVar10->child[1] = pmVar5;
              pmVar5->parent = pmVar10;
            }
          }
        }
        else {
          if (pmVar5 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104e79;
          pmVar5->child[pmVar5->child[0] != (malloc_tree_chunk *)p] = pmVar10;
          if (pmVar10 != (malloc_tree_chunk *)0x0) goto LAB_00104a5b;
        }
      }
    }
  }
  pmVar3 = (tbinptr)m->least_addr;
  if (pmVar1 < pmVar3) goto LAB_00104e79;
  uVar13 = pmVar1->head;
  if ((uVar13 & 2) == 0) {
    if (pmVar1 == (tbinptr)m->top) {
      uVar13 = psize + m->topsize;
      m->topsize = uVar13;
      m->top = p;
      ((tbinptr)p)->head = uVar13 | 1;
      if ((tbinptr)p != (tbinptr)m->dv) {
        return;
      }
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
      return;
    }
    if (pmVar1 == (tbinptr)m->dv) {
      uVar13 = psize + m->dvsize;
      m->dvsize = uVar13;
      m->dv = p;
      ((tbinptr)p)->head = uVar13 | 1;
      *(ulong *)((long)((tbinptr)p)->child + (uVar13 - 0x20)) = uVar13;
      return;
    }
    if (uVar13 < 0x100) {
      pmVar4 = pmVar1->fd;
      pmVar15 = pmVar1->bk;
      if ((pmVar4 != (tbinptr)(m->smallbins + (uVar13 >> 3) * 2)) &&
         ((pmVar4 < pmVar3 || (pmVar4->bk != pmVar1)))) goto LAB_00104e79;
      if (pmVar15 == pmVar4) {
        bVar11 = (byte)(uVar13 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar15 != (tbinptr)(m->smallbins + (uVar13 >> 3) * 2)) &&
           ((pmVar15 < pmVar3 || (pmVar15->fd != pmVar1)))) goto LAB_00104e79;
        pmVar4->bk = pmVar15;
        pmVar15->fd = pmVar4;
      }
    }
    else {
      pmVar10 = pmVar1->bk;
      pmVar5 = pmVar1->child[2];
      if (pmVar10 == pmVar1) {
        if (pmVar1->child[1] == (malloc_tree_chunk *)0x0) {
          if (pmVar1->child[0] == (malloc_tree_chunk *)0x0) {
            pmVar10 = (malloc_tree_chunk *)0x0;
            goto LAB_00104db9;
          }
          pmVar6 = pmVar1->child[0];
          pmVar4 = (tbinptr)pmVar1->child;
        }
        else {
          pmVar6 = pmVar1->child[1];
          pmVar4 = (tbinptr)(pmVar1->child + 1);
        }
        do {
          do {
            pmVar15 = pmVar4;
            pmVar10 = pmVar6;
            pmVar6 = pmVar10->child[1];
            pmVar4 = (tbinptr)(pmVar10->child + 1);
          } while (pmVar10->child[1] != (malloc_tree_chunk *)0x0);
          pmVar6 = pmVar10->child[0];
          pmVar4 = (tbinptr)pmVar10->child;
        } while (pmVar10->child[0] != (malloc_tree_chunk *)0x0);
        if (pmVar15 < pmVar3) goto LAB_00104e79;
        pmVar15->prev_foot = 0;
      }
      else {
        pmVar4 = pmVar1->fd;
        if (((pmVar4 < pmVar3) || (pmVar4->bk != pmVar1)) || (pmVar10->fd != pmVar1))
        goto LAB_00104e79;
        pmVar4->bk = pmVar10;
        pmVar10->fd = pmVar4;
      }
LAB_00104db9:
      if (pmVar5 != (malloc_tree_chunk *)0x0) {
        uVar9 = *(uint *)(pmVar1->child + 3);
        if (pmVar1 == m->treebins[uVar9]) {
          m->treebins[uVar9] = pmVar10;
          if (pmVar10 == (malloc_tree_chunk *)0x0) {
            bVar11 = (byte)uVar9 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
          }
          else {
LAB_00104df7:
            pmVar6 = (malloc_tree_chunk *)m->least_addr;
            if (pmVar10 < pmVar6) goto LAB_00104e79;
            pmVar10->child[2] = pmVar5;
            pmVar5 = pmVar1->child[0];
            if (pmVar5 != (malloc_tree_chunk *)0x0) {
              if (pmVar5 < pmVar6) goto LAB_00104e79;
              pmVar10->child[0] = pmVar5;
              pmVar5->child[2] = pmVar10;
            }
            pmVar5 = pmVar1->child[1];
            if (pmVar5 != (malloc_tree_chunk *)0x0) {
              if (pmVar5 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104e79;
              pmVar10->child[1] = pmVar5;
              pmVar5->parent = pmVar10;
            }
          }
        }
        else {
          if (pmVar5 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104e79;
          pmVar5->child[pmVar5->child[0] != pmVar1] = pmVar10;
          if (pmVar10 != (malloc_tree_chunk *)0x0) goto LAB_00104df7;
        }
      }
    }
    psize = psize + (uVar13 & 0xfffffffffffffff8);
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
    if ((tbinptr)p == (tbinptr)m->dv) {
      m->dvsize = psize;
      return;
    }
  }
  else {
    pmVar1->head = uVar13 & 0xfffffffffffffffe;
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
  }
  if (psize < 0x100) {
    uVar13 = psize >> 3;
    if ((m->smallmap >> ((uint)uVar13 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << ((byte)uVar13 & 0x1f);
      pmVar10 = (malloc_tree_chunk *)(m->smallbins + uVar13 * 2);
    }
    else {
      pmVar10 = (malloc_tree_chunk *)m->smallbins[uVar13 * 2 + 2];
      if ((malloc_tree_chunk *)m->smallbins[uVar13 * 2 + 2] < (malloc_tree_chunk *)m->least_addr) {
LAB_00104e79:
        abort();
      }
    }
    m->smallbins[uVar13 * 2 + 2] = p;
    pmVar10->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = pmVar10;
    ((tbinptr)p)->bk = (malloc_tree_chunk *)(m->smallbins + uVar13 * 2);
  }
  else {
    uVar9 = (uint)(psize >> 8);
    if (uVar9 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar9 < 0x10000) {
        uVar12 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = (uint)((psize >> ((ulong)(byte)(0x26 - (char)(uVar12 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar12 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar10 = (malloc_tree_chunk *)(m->treebins + uVar12);
    *(uint *)(((tbinptr)p)->child + 3) = uVar12;
    ((tbinptr)p)->child[0] = (malloc_tree_chunk *)0x0;
    ((tbinptr)p)->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> (uVar12 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << ((byte)uVar12 & 0x1f);
      pmVar10->prev_foot = (size_t)p;
    }
    else {
      bVar11 = 0x39 - (char)(uVar12 >> 1);
      if (uVar12 == 0x1f) {
        bVar11 = 0;
      }
      lVar14 = psize << (bVar11 & 0x3f);
      pmVar5 = (malloc_tree_chunk *)pmVar10->prev_foot;
      do {
        pmVar10 = pmVar5;
        if ((pmVar10->head & 0xfffffffffffffff8) == psize) {
          if (((malloc_tree_chunk *)m->least_addr <= pmVar10) &&
             (pmVar5 = pmVar10->fd, (malloc_tree_chunk *)m->least_addr <= pmVar5)) {
            pmVar5->bk = (malloc_tree_chunk *)p;
            pmVar10->fd = (malloc_tree_chunk *)p;
            ((tbinptr)p)->fd = pmVar5;
            ((tbinptr)p)->bk = pmVar10;
            ((tbinptr)p)->child[2] = (malloc_tree_chunk *)0x0;
            return;
          }
          goto LAB_00104e79;
        }
        lVar7 = lVar14 >> 0x3f;
        lVar14 = lVar14 * 2;
        pmVar5 = *(malloc_tree_chunk **)((long)pmVar10 + lVar7 * -8 + 0x20);
      } while (pmVar5 != (malloc_tree_chunk *)0x0);
      pcVar2 = (char *)((long)pmVar10 + lVar7 * -8 + 0x20);
      if (pcVar2 < m->least_addr) goto LAB_00104e79;
      *(mchunkptr *)pcVar2 = p;
    }
    ((tbinptr)p)->child[2] = pmVar10;
    ((tbinptr)p)->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = (malloc_tree_chunk *)p;
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}